

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_loopfilter.c
# Opt level: O1

uint8_t get_filter_level(AV1_COMMON *cm,loop_filter_info_n *lfi_n,int dir_idx,int plane,
                        MB_MODE_INFO *mbmi)

{
  uint8_t uVar1;
  uint uVar2;
  int8_t *piVar3;
  ulong uVar4;
  uint uVar5;
  int *piVar6;
  int iVar7;
  int iVar8;
  byte bVar9;
  
  bVar9 = mbmi->field_0xa7 & 7;
  if ((cm->delta_q_info).delta_lf_present_flag == 0) {
    uVar4 = (ulong)lfi_n->lvl[plane][bVar9][(uint)dir_idx][mbmi->ref_frame[0]]
                   [mode_lf_lut[mbmi->mode]];
  }
  else {
    if ((cm->delta_q_info).delta_lf_multi == 0) {
      piVar3 = &mbmi->delta_lf_from_base;
    }
    else {
      piVar3 = mbmi->delta_lf + delta_lf_id_lut[plane][(uint)dir_idx];
    }
    if (plane == 1) {
      piVar6 = &(cm->lf).filter_level_u;
    }
    else if (plane == 0) {
      piVar6 = (cm->lf).filter_level + (uint)dir_idx;
    }
    else {
      piVar6 = &(cm->lf).filter_level_v;
    }
    uVar5 = 0x3f;
    if ((int)*piVar3 + *piVar6 < 0x3f) {
      uVar5 = (int)*piVar3 + *piVar6;
    }
    uVar2 = 0;
    if (0 < (int)uVar5) {
      uVar2 = uVar5;
    }
    uVar4 = (ulong)uVar2;
    if (((cm->seg).enabled != '\0') &&
       (((cm->seg).feature_mask[bVar9] >> (seg_lvl_lf_lut[plane][(uint)dir_idx] & 0x1f) & 1) != 0))
    {
      uVar2 = uVar2 + (int)(cm->seg).feature_data[bVar9][(uint)seg_lvl_lf_lut[plane][(uint)dir_idx]]
      ;
      uVar5 = 0x3f;
      if ((int)uVar2 < 0x3f) {
        uVar5 = uVar2;
      }
      uVar4 = 0;
      if (0 < (int)uVar5) {
        uVar4 = (ulong)uVar5;
      }
    }
    if ((cm->lf).mode_ref_delta_enabled != '\0') {
      iVar7 = (int)(cm->lf).ref_deltas[mbmi->ref_frame[0]];
      if (0 < (long)mbmi->ref_frame[0]) {
        iVar7 = iVar7 + (cm->lf).mode_deltas[mode_lf_lut[mbmi->mode]];
      }
      iVar8 = (iVar7 << ((byte)(uVar4 >> 5) & 0x1f)) + (int)uVar4;
      iVar7 = 0x3f;
      if (iVar8 < 0x3f) {
        iVar7 = iVar8;
      }
      uVar1 = '\0';
      if (0 < iVar7) {
        uVar1 = (uint8_t)iVar7;
      }
      return uVar1;
    }
  }
  return (uint8_t)uVar4;
}

Assistant:

static uint8_t get_filter_level(const AV1_COMMON *cm,
                                const loop_filter_info_n *lfi_n,
                                const int dir_idx, int plane,
                                const MB_MODE_INFO *mbmi) {
  const int segment_id = mbmi->segment_id;
  if (cm->delta_q_info.delta_lf_present_flag) {
    int8_t delta_lf;
    if (cm->delta_q_info.delta_lf_multi) {
      const int delta_lf_idx = delta_lf_id_lut[plane][dir_idx];
      delta_lf = mbmi->delta_lf[delta_lf_idx];
    } else {
      delta_lf = mbmi->delta_lf_from_base;
    }
    int base_level;
    if (plane == 0)
      base_level = cm->lf.filter_level[dir_idx];
    else if (plane == 1)
      base_level = cm->lf.filter_level_u;
    else
      base_level = cm->lf.filter_level_v;
    int lvl_seg = clamp(delta_lf + base_level, 0, MAX_LOOP_FILTER);
    assert(plane >= 0 && plane <= 2);
    const int seg_lf_feature_id = seg_lvl_lf_lut[plane][dir_idx];
    if (segfeature_active(&cm->seg, segment_id, seg_lf_feature_id)) {
      const int data = get_segdata(&cm->seg, segment_id, seg_lf_feature_id);
      lvl_seg = clamp(lvl_seg + data, 0, MAX_LOOP_FILTER);
    }

    if (cm->lf.mode_ref_delta_enabled) {
      const int scale = 1 << (lvl_seg >> 5);
      lvl_seg += cm->lf.ref_deltas[mbmi->ref_frame[0]] * scale;
      if (mbmi->ref_frame[0] > INTRA_FRAME)
        lvl_seg += cm->lf.mode_deltas[mode_lf_lut[mbmi->mode]] * scale;
      lvl_seg = clamp(lvl_seg, 0, MAX_LOOP_FILTER);
    }
    return lvl_seg;
  } else {
    return lfi_n->lvl[plane][segment_id][dir_idx][mbmi->ref_frame[0]]
                     [mode_lf_lut[mbmi->mode]];
  }
}